

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autoutils.c
# Opt level: O1

int nsdiffs(double *x,int N,int f,double *alpha,char *test,int *max_D)

{
  int iVar1;
  double *sig;
  double *oup;
  int iVar2;
  int iVar3;
  size_t __size;
  double dVar4;
  
  if (alpha == (double *)0x0) {
    dVar4 = 0.05;
  }
  else {
    dVar4 = *alpha;
  }
  if (max_D == (int *)0x0) {
    iVar2 = 1;
  }
  else {
    iVar2 = *max_D;
  }
  if (iVar2 < 0) {
    puts("Error. Maximum Difference cannot be less than 0 ");
    exit(-1);
  }
  if (dVar4 < 0.01) {
    puts("Warning : Alpha only takes values from 0.01 o 0.1. Setting alpha to 0.01. ");
    dVar4 = 0.01;
  }
  if (0.1 < dVar4) {
    puts("Warning : Alpha only takes values from 0.01 o 0.1. Setting alpha to 0.1. ");
    dVar4 = 0.1;
  }
  iVar1 = strcmp(test,"ocsb");
  if (((dVar4 != 0.05) || (NAN(dVar4))) && (iVar1 == 0)) {
    printf(
          "Significance levels other than 5%% are not currently supported by test=\'ocsb\', defaulting to alpha = 0.05."
          );
  }
  iVar1 = checkConstant(x,N);
  iVar3 = 0;
  if (iVar1 != 1) {
    if (f < 2) {
      puts("Warning : Only data with f > 1 can be differenced. ");
    }
    else {
      iVar1 = runseasonalitytests(x,N,f,test);
      __size = (long)N << 3;
      sig = (double *)malloc(__size);
      oup = (double *)malloc(__size);
      memcpy(sig,x,__size);
      iVar3 = 0;
      if (iVar2 != 0 && iVar1 == 1) {
        iVar1 = 1;
        while( true ) {
          iVar3 = iVar1;
          N = diffs(sig,N,1,f,oup);
          iVar1 = checkConstant(oup,N);
          if (iVar1 == 1) break;
          iVar1 = runseasonalitytests(oup,N,f,test);
          memcpy(sig,oup,(long)N << 3);
          if ((iVar1 != 1) || (iVar1 = iVar3 + 1, iVar2 <= iVar3)) break;
        }
      }
      free(sig);
      free(oup);
    }
  }
  return iVar3;
}

Assistant:

int nsdiffs(double *x, int N,int f,double *alpha, const char *test, int *max_D)  {
    int D,max_D_,cc,NX,dodiff;
    double alpha_;
    double *y,*z;

    D = 0;

    alpha_ = alpha == NULL ? 0.05 : *alpha;
    max_D_ = max_D == NULL ? 1 : *max_D;

    if (max_D_ < 0) {
        printf("Error. Maximum Difference cannot be less than 0 \n");
        exit(-1);
    } 

    if (alpha_ < 0.01) {
        alpha_ = 0.01;
        printf("Warning : Alpha only takes values from 0.01 o 0.1. Setting alpha to 0.01. \n");
    }

    if (alpha_ > 0.1) {
        alpha_ = 0.1;
        printf("Warning : Alpha only takes values from 0.01 o 0.1. Setting alpha to 0.1. \n");
    }

    if (!strcmp(test,"ocsb")) {
        if (alpha_ != 0.05) {
            printf("Significance levels other than 5%% are not currently supported by test='ocsb', defaulting to alpha = 0.05.");
            alpha_ = 0.05;
        }
    }

    cc = checkConstant(x,N);
    //printf("cc %d \n",cc);

    if (cc == 1) return D;

    NX = N;

    if (f <= 1) {
        printf("Warning : Only data with f > 1 can be differenced. \n");
        return 0;
    }

    dodiff = runseasonalitytests(x,N,f,test);

    y = (double*)malloc(sizeof(double)*NX);
    z = (double*)malloc(sizeof(double)*NX);

    memcpy(y,x,sizeof(double)*NX);

    while (dodiff == 1 && D < max_D_) {
        D++;
        NX = diffs(y,NX,1,f,z);

        cc = checkConstant(z,NX);

        //printf("cc %d \n",cc);

        if (cc == 1) break;

        dodiff = runseasonalitytests(z,NX,f,test);
        memcpy(y,z,sizeof(double)*NX);
    }

    free(y);
    free(z);

    return D;
}